

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushLiteral::encode(PushLiteral *this,uint8_t *buffer)

{
  uint uVar1;
  uint8_t *puVar2;
  
  uVar1 = this->index;
  if ((int)uVar1 < 0x20) {
    *buffer = (char)uVar1 + ' ';
    puVar2 = buffer + 1;
  }
  else {
    InstructionNode::encodeExtA(&this->super_InstructionNode,buffer,(ulong)(uVar1 >> 8));
    *buffer = 0xe4;
    buffer[1] = (uint8_t)this->index;
    puVar2 = buffer + 2;
  }
  return puVar2;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(index < BytecodeSet::PushLiteralShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushLiteralShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);
        *buffer++ = BytecodeSet::PushLiteral;
        *buffer++ = index % 256;
        return buffer;
	}